

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          CappedArray<char,_8UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,String *params_5,
          ArrayPtr<const_char> *params_6,String *params_7,ArrayPtr<const_char> *params_8)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *pcVar3;
  size_t result;
  size_t sVar4;
  long lVar5;
  size_t result_2;
  char *pcVar6;
  String local_a8;
  char *local_88 [3];
  size_t sStack_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  CappedArray<char,_8UL> *local_40;
  ArrayPtr<const_char> *local_38;
  
  sVar4 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_88[0] = (this->text).content.ptr;
  local_88[1] = params->ptr;
  local_88[2] = *(char **)params_1->content;
  sStack_70 = params_2->size_;
  local_68 = params_3->size_;
  local_60 = params_4->size_ - 1;
  if (params_4->size_ == 0) {
    local_60 = sVar4;
  }
  local_58 = (params_5->content).size_;
  local_50 = params_6->size_ - 1;
  if (params_6->size_ == 0) {
    local_50 = sVar4;
  }
  local_48 = (params_7->content).size_;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_88 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x48);
  __return_storage_ptr__->size_ = sVar4;
  sVar4 = 0;
  local_60 = 0;
  local_50 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_88 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x48);
  local_38 = params;
  heapString(&local_a8,sVar4);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar6,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_a8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_a8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_a8.content.disposer;
  sVar4 = 0;
  local_68 = 0;
  local_88[2] = (char *)0x0;
  sStack_70 = 0;
  local_88[0] = (char *)0x0;
  local_88[1] = (char *)0x0;
  local_60 = 1;
  local_58 = 0;
  local_50 = 1;
  local_48 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_88 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x48);
  local_40 = params_1;
  local_a8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar4,sVar4,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_a8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_a8.content.size_ = sVar4;
  if (pBVar2 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_a8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_a8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_a8.content.disposer;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  pcVar3 = (this->text).content.ptr;
  if (pcVar3 != (char *)0x0) {
    memcpy(pcVar6,(void *)this->size_,(size_t)pcVar3);
    pcVar6 = pcVar6 + (long)pcVar3;
  }
  pcVar3 = local_38->ptr;
  if (pcVar3 != (char *)0x0) {
    memcpy(pcVar6,&local_38->size_,(size_t)pcVar3);
    pcVar6 = pcVar6 + (long)pcVar3;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,(ArrayPtr<const_char> *)local_40,params_2,params_3,
             (String *)params_4,(ArrayPtr<const_char> *)params_5,(String *)params_6,
             (ArrayPtr<const_char> *)params_7);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}